

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O1

int gdImageTrueColorToPaletteBody(gdImagePtr oim,int dither,int colorsWanted,gdImagePtr *cimP)

{
  size_t size;
  ushort uVar1;
  int **ppiVar2;
  int iVar3;
  int iVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  gdImagePtr pgVar10;
  gdImagePtr oim_00;
  uchar **ppuVar11;
  void *pvVar12;
  gdImagePtr nim;
  ulong uVar13;
  int *piVar14;
  boxptr boxp;
  gdImagePtr pgVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  my_cquantize_ptr cquantize;
  my_cquantize_ptr cquantize_00;
  long lVar19;
  int i;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  gdImagePtr nim_00;
  int iVar24;
  char cVar25;
  int iVar26;
  uint *puVar27;
  long lVar28;
  int iVar29;
  short sVar30;
  long lVar31;
  uchar *puVar32;
  long lVar33;
  uint uVar34;
  uint c1;
  ulong uVar35;
  short *psVar36;
  int i_1;
  uint uVar37;
  int iVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  bool bVar43;
  long local_d8;
  short local_c8;
  hist3d histogram;
  
  pgVar10 = oim;
  if (cimP != (gdImagePtr *)0x0) {
    pgVar10 = gdImageCreate(oim->sx,oim->sy);
    *cimP = pgVar10;
    if (pgVar10 == (gdImagePtr)0x0) {
      return 0;
    }
  }
  if (oim->trueColor == 0) {
    if (cimP != (gdImagePtr *)0x0) {
      gdImageCopy(pgVar10,oim,0,0,0,0,oim->sx,oim->sy);
      *cimP = pgVar10;
      return 1;
    }
    return 1;
  }
  uVar34 = 0xff - (oim->transparent >> 0x1f);
  uVar35 = (ulong)uVar34;
  if (colorsWanted <= (int)uVar34) {
    uVar35 = (ulong)(uint)colorsWanted;
  }
  if (cimP == (gdImagePtr *)0x0) {
    ppuVar11 = (uchar **)gdCalloc(8,(long)oim->sy);
    pgVar10->pixels = ppuVar11;
    if (ppuVar11 != (uchar **)0x0) {
      if (0 < pgVar10->sy) {
        lVar20 = 0;
        do {
          puVar32 = (uchar *)gdCalloc(1,(long)oim->sx);
          pgVar10->pixels[lVar20] = puVar32;
          if (pgVar10->pixels[lVar20] == (uchar *)0x0) goto LAB_0011e8b6;
          lVar20 = lVar20 + 1;
        } while (lVar20 < pgVar10->sy);
      }
      goto LAB_0011e37a;
    }
LAB_0011e8b6:
    oim_00 = (gdImagePtr)0x0;
  }
  else {
LAB_0011e37a:
    iVar24 = (int)uVar35;
    if (oim->paletteQuantizationMethod == 2) {
      if (cimP != (gdImagePtr *)0x0) {
        gdImageDestroy(pgVar10);
      }
      iVar16 = 2;
      if (oim->paletteQuantizationSpeed != 0) {
        iVar16 = oim->paletteQuantizationSpeed;
      }
      pgVar10 = gdImageNeuQuant(oim,iVar24,iVar16);
      if (cimP != (gdImagePtr *)0x0) {
        *cimP = pgVar10;
      }
      if (pgVar10 == (gdImagePtr)0x0) {
        return 0;
      }
      free_truecolor_image_data(oim);
      gdImageCopy(oim,pgVar10,0,0,0,0,oim->sx,oim->sy);
      gdImageDestroy(pgVar10);
      return 1;
    }
    oim_00 = (gdImagePtr)gdCalloc(0x28,1);
    if (oim_00 == (gdImagePtr)0x0) {
      oim_00 = (gdImagePtr)0x0;
    }
    else {
      lVar20 = 0;
      oim_00->sx = 0;
      oim_00->sy = 0;
      oim_00->red[1] = 0;
      oim_00->red[2] = 0;
      ppuVar11 = (uchar **)gdMalloc(0x100);
      oim_00->pixels = ppuVar11;
      do {
        pvVar12 = gdMalloc(0x1000);
        boxp = (boxptr)oim_00->pixels;
        *(void **)(&boxp->c0min + lVar20 * 2) = pvVar12;
        if (oim_00->pixels[lVar20] == (uchar *)0x0) goto LAB_0011e8cd;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x20);
      pvVar12 = gdMalloc(6);
      *(void **)&oim_00->sx = pvVar12;
      pvVar12 = gdMalloc(0x7fc);
      *(void **)(oim_00->red + 3) = pvVar12;
      if (pvVar12 != (void *)0x0) {
        lVar20 = (long)pvVar12 + 0x3fc;
        *(long *)(oim_00->red + 1) = lVar20;
        lVar18 = 0;
        lVar23 = 0;
        do {
          *(int *)(lVar20 + lVar23 * 4) = (int)lVar23;
          *(int *)(lVar20 + lVar18 * 4) = (int)lVar18;
          lVar23 = lVar23 + 1;
          lVar18 = lVar18 + -1;
        } while (lVar18 != -0x10);
        piVar14 = (int *)((long)pvVar12 + 0x3bc);
        iVar16 = 0x10;
        lVar20 = 0;
        do {
          *(int *)((long)pvVar12 + lVar20 * 4 + 0x43c) = iVar16;
          *piVar14 = -iVar16;
          iVar16 = iVar16 + ((int)lVar20 + 0x10U & 1);
          lVar20 = lVar20 + 1;
          piVar14 = piVar14 + -1;
        } while (lVar20 != 0x20);
        boxp = (boxptr)((long)pvVar12 + 0x33c);
        lVar20 = 0;
        do {
          *(undefined4 *)((long)pvVar12 + lVar20 * 4 + 0x4bc) = 0x20;
          boxp->c0min = -0x20;
          lVar20 = lVar20 + 1;
          boxp = (boxptr)((long)&boxp[-1].colorcount + 4);
        } while (lVar20 != 0xd0);
      }
      size = (long)pgVar10->sx * 6 + 0xc;
      pvVar12 = gdReallocEx(*(void **)&oim_00->sx,size);
      *(void **)&oim_00->sx = pvVar12;
      if (pvVar12 != (void *)0x0) {
        lVar20 = 0;
        memset(pvVar12,0,size);
        oim_00->colorsTotal = 0;
        ppuVar11 = oim_00->pixels;
        do {
          memset(ppuVar11[lVar20],0,0x1000);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x20);
        iVar16 = oim->sy;
        if (0 < (long)iVar16) {
          boxp = (boxptr)oim_00->pixels;
          iVar26 = oim->sx;
          ppiVar2 = oim->tpixels;
          lVar20 = 0;
          do {
            if (0 < iVar26) {
              puVar27 = (uint *)ppiVar2[lVar20];
              uVar34 = oim->transparent;
              iVar29 = iVar26 + 1;
              do {
                uVar40 = *puVar27;
                if (((int)uVar34 < 0) || (uVar40 != uVar34)) {
                  lVar18 = (ulong)(uVar40 >> 4 & 0xfc0) +
                           *(long *)((long)&boxp->c0min + (ulong)(uVar40 >> 0x10 & 0xf8));
                  uVar13 = (ulong)(uVar40 >> 2 & 0x3e);
                  sVar5 = *(short *)(uVar13 + lVar18);
                  sVar30 = sVar5 + 1;
                  if (sVar30 == 0) {
                    sVar30 = sVar5;
                  }
                  *(short *)(uVar13 + lVar18) = sVar30;
                }
                puVar27 = puVar27 + 1;
                iVar29 = iVar29 + -1;
              } while (1 < iVar29);
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != iVar16);
        }
        iVar16 = overflow2(iVar24,0x28);
        if ((iVar16 == 0) &&
           (nim = (gdImagePtr)gdMalloc((long)iVar24 * 0x28), nim != (gdImagePtr)0x0)) {
          nim->pixels = (uchar **)0x1f00000000;
          nim->sx = 0;
          nim->sy = 0x3f;
          nim->colorsTotal = 0;
          nim->red[0] = 0x1f;
          update_box(oim_00,nim,cquantize,boxp);
          uVar13 = 1;
          if (1 < colorsWanted) {
            uVar42 = 1;
            do {
              if (uVar35 < uVar42 * 2) {
                nim_00 = (gdImagePtr)0x0;
                iVar24 = 0;
                uVar13 = uVar42;
                pgVar15 = nim;
                do {
                  if (iVar24 < pgVar15->red[1]) {
                    nim_00 = pgVar15;
                    iVar24 = pgVar15->red[1];
                  }
                  pgVar15 = (gdImagePtr)(pgVar15->red + 5);
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              else {
                nim_00 = (gdImagePtr)0x0;
                lVar20 = 0;
                uVar13 = uVar42;
                pgVar15 = nim;
                do {
                  if ((lVar20 < *(long *)(pgVar15->red + 3)) && (0 < pgVar15->red[1])) {
                    lVar20 = *(long *)(pgVar15->red + 3);
                    nim_00 = pgVar15;
                  }
                  pgVar15 = (gdImagePtr)(pgVar15->red + 5);
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              uVar13 = uVar42;
              if (nim_00 == (gdImagePtr)0x0) break;
              nim->red[uVar42 * 10 + -4] = *(int *)((long)&nim_00->pixels + 4);
              nim->red[uVar42 * 10 + -2] = nim_00->sy;
              nim->red[uVar42 * 10] = nim_00->red[0];
              nim->red[uVar42 * 10 + -5] = *(int *)&nim_00->pixels;
              nim->red[uVar42 * 10 + -3] = nim_00->sx;
              nim->red[uVar42 * 10 + -1] = nim_00->colorsTotal;
              iVar24 = *(int *)((long)&nim_00->pixels + 4);
              iVar29 = (iVar24 - *(int *)&nim_00->pixels) * 0x10;
              iVar26 = nim_00->sy - nim_00->sx;
              iVar16 = iVar26 * 0xc;
              bVar43 = iVar29 + iVar26 * -0xc < 0;
              iVar26 = iVar29;
              if (iVar29 == iVar16 || SBORROW4(iVar29,iVar16) != bVar43) {
                iVar26 = iVar16;
              }
              cVar25 = iVar29 == iVar16 || SBORROW4(iVar29,iVar16) != bVar43;
              if (iVar26 < (nim_00->red[0] - nim_00->colorsTotal) * 8) {
                cVar25 = '\x02';
              }
              if (cVar25 == '\x02') {
                piVar14 = nim_00->red;
                pgVar15 = (gdImagePtr)(nim->red + uVar42 * 10 + -1);
                iVar24 = nim_00->colorsTotal + nim_00->red[0];
              }
              else if (cVar25 == '\x01') {
                piVar14 = &nim_00->sy;
                iVar24 = nim_00->sx + nim_00->sy;
                pgVar15 = (gdImagePtr)(nim->red + uVar42 * 10 + -3);
              }
              else {
                piVar14 = (int *)((long)&nim_00->pixels + 4);
                iVar24 = *(int *)&nim_00->pixels + iVar24;
                pgVar15 = (gdImagePtr)(nim->red + uVar42 * 10 + -5);
              }
              *piVar14 = iVar24 / 2;
              uVar34 = iVar24 / 2 + 1;
              *(uint *)&pgVar15->pixels = uVar34;
              update_box(oim_00,nim_00,(my_cquantize_ptr)(ulong)uVar34,(boxptr)pgVar15);
              update_box(oim_00,(gdImagePtr)(nim->red + uVar42 * 10 + -5),cquantize_00,
                         (boxptr)pgVar15);
              uVar42 = uVar42 + 1;
              uVar13 = uVar35;
            } while (uVar42 != uVar35);
          }
          iVar24 = (int)uVar13;
          if (0 < iVar24) {
            ppuVar11 = oim_00->pixels;
            uVar35 = 0;
            do {
              lVar20 = (long)nim->red[uVar35 * 10 + -5];
              if (nim->red[uVar35 * 10 + -4] < nim->red[uVar35 * 10 + -5]) {
                lVar28 = 0;
                lVar18 = 0;
                lVar33 = 0;
                lVar23 = 0;
              }
              else {
                iVar16 = nim->red[uVar35 * 10 + -1];
                iVar26 = nim->red[uVar35 * 10 + -3];
                lVar23 = 0;
                lVar33 = 0;
                lVar18 = 0;
                lVar28 = 0;
                do {
                  if (iVar26 <= nim->red[uVar35 * 10 + -2]) {
                    puVar32 = ppuVar11[lVar20] + (long)iVar26 * 0x40 + (long)iVar16 * 2;
                    lVar31 = (long)iVar26;
                    do {
                      if (iVar16 <= nim->red[uVar35 * 10]) {
                        lVar19 = 0;
                        iVar29 = iVar16 * 8 + 4;
                        do {
                          uVar42 = (ulong)*(ushort *)(puVar32 + lVar19 * 2);
                          if (uVar42 != 0) {
                            lVar28 = lVar28 + uVar42;
                            lVar18 = lVar18 + uVar42 * (long)((int)lVar20 * 8 + 4);
                            lVar33 = lVar33 + uVar42 * (long)((int)lVar31 * 4 + 2);
                            lVar23 = lVar23 + (long)iVar29 * uVar42;
                          }
                          lVar19 = lVar19 + 1;
                          iVar29 = iVar29 + 8;
                        } while ((nim->red[uVar35 * 10] - iVar16) + 1 != (int)lVar19);
                      }
                      lVar31 = lVar31 + 1;
                      puVar32 = puVar32 + 0x40;
                    } while (nim->red[uVar35 * 10 + -2] + 1 != (int)lVar31);
                  }
                  lVar20 = lVar20 + 1;
                } while (nim->red[uVar35 * 10 + -4] + 1 != (int)lVar20);
              }
              if (lVar28 == 0) {
                iVar16 = 0xff;
                pgVar10->red[uVar35] = 0xff;
                pgVar10->green[uVar35] = 0xff;
              }
              else {
                lVar20 = lVar28 >> 1;
                pgVar10->red[uVar35] = (int)((lVar18 + lVar20) / lVar28);
                pgVar10->green[uVar35] = (int)((lVar33 + lVar20) / lVar28);
                iVar16 = (int)((lVar23 + lVar20) / lVar28);
              }
              pgVar10->blue[uVar35] = iVar16;
              pgVar10->open[uVar35] = 0;
              uVar35 = uVar35 + 1;
            } while (uVar35 != (uVar13 & 0xffffffff));
          }
          pgVar10->colorsTotal = iVar24;
          if (-1 < oim->transparent) {
            pgVar10->red[iVar24] = (uint)oim->transparent >> 0x10 & 0xff;
            pgVar10->green[pgVar10->colorsTotal] = (uint)*(byte *)((long)&oim->transparent + 1);
            pgVar10->blue[pgVar10->colorsTotal] = (uint)(byte)oim->transparent;
            pgVar10->alpha[pgVar10->colorsTotal] = 0x7f;
            pgVar10->open[pgVar10->colorsTotal] = 0;
          }
          gdFree(nim);
        }
        ppuVar11 = oim_00->pixels;
        lVar20 = 0;
        do {
          memset(ppuVar11[lVar20],0,0x1000);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x20);
        if (dither == 0) {
          pass2_no_dither(oim,pgVar10,(my_cquantize_ptr)oim_00);
        }
        else {
          iVar24 = oim->sy;
          if (0 < (long)iVar24) {
            ppuVar11 = oim_00->pixels;
            lVar20 = *(long *)(oim_00->red + 1);
            iVar16 = oim->sx;
            lVar18 = 0;
            do {
              piVar14 = oim->tpixels[lVar18];
              puVar32 = pgVar10->pixels[lVar18];
              if (oim_00->colorsTotal == 0) {
                psVar36 = *(short **)&oim_00->sx;
                iVar26 = 3;
                local_d8 = 1;
              }
              else {
                piVar14 = piVar14 + ((long)iVar16 + -1) * 3;
                puVar32 = puVar32 + (int)((long)iVar16 + -1);
                psVar36 = (short *)((long)(iVar16 * 3 + 3) * 2 + *(long *)&oim_00->sx);
                iVar26 = -3;
                local_d8 = -1;
              }
              iVar29 = 0;
              local_c8 = 0;
              if (iVar16 < 1) {
                sVar5 = 0;
                sVar30 = 0;
              }
              else {
                lVar23 = 0;
                iVar17 = 0;
                iVar6 = 0;
                iVar39 = 0;
                iVar3 = 0;
                iVar4 = 0;
                iVar7 = 0;
                iVar8 = 0;
                iVar9 = 0;
                iVar22 = iVar16 + 1;
                do {
                  if ((oim->transparent < 0) || (piVar14[lVar23] != oim->transparent)) {
                    uVar34 = piVar14[lVar23];
                    uVar40 = (uVar34 >> 0x10 & 0xff) +
                             *(int *)(lVar20 + (long)(iVar29 + psVar36[iVar26] + 8 >> 4) * 4);
                    if ((int)uVar40 < 1) {
                      uVar40 = 0;
                    }
                    if (0xfe < (int)uVar40) {
                      uVar40 = 0xff;
                    }
                    uVar37 = (uVar34 >> 8 & 0xff) +
                             *(int *)(lVar20 + (long)(iVar17 + psVar36[iVar26 + 1] + 8 >> 4) * 4);
                    if ((int)uVar37 < 1) {
                      uVar37 = 0;
                    }
                    if (0xfe < (int)uVar37) {
                      uVar37 = 0xff;
                    }
                    uVar34 = (uVar34 & 0xff) +
                             *(int *)(lVar20 + (long)(iVar6 + psVar36[iVar26 + 2] + 8 >> 4) * 4);
                    if ((int)uVar34 < 1) {
                      uVar34 = 0;
                    }
                    if (0xfe < (int)uVar34) {
                      uVar34 = 0xff;
                    }
                    c1 = uVar34 >> 3;
                    lVar33 = (ulong)((uVar37 >> 2) << 6) +
                             *(long *)((long)ppuVar11 + (ulong)(uVar40 & 0xf8));
                    if (*(short *)(lVar33 + (ulong)c1 * 2) == 0) {
                      fill_inverse_cmap(pgVar10,oim_00,(my_cquantize_ptr)(ulong)(uVar40 >> 3),
                                        uVar37 >> 2,c1,(int)oim);
                    }
                    uVar1 = *(ushort *)(lVar33 + (ulong)c1 * 2);
                    puVar32[lVar23] = (char)uVar1 + 0xff;
                    iVar41 = uVar40 - pgVar10->red[(ulong)uVar1 - 1];
                    iVar38 = uVar37 - pgVar10->green[(ulong)uVar1 - 1];
                    iVar21 = uVar34 - pgVar10->blue[(ulong)uVar1 - 1];
                    *psVar36 = (short)iVar41 * 3 + (short)iVar7;
                    psVar36[1] = (short)iVar38 * 3 + (short)iVar8;
                    psVar36[2] = (short)iVar21 * 3 + (short)iVar9;
                    iVar7 = iVar41 * 5 + iVar39;
                    iVar29 = iVar41 * 7;
                    iVar8 = iVar38 * 5 + iVar3;
                    iVar17 = iVar38 * 7;
                    iVar9 = iVar21 * 5 + iVar4;
                    iVar6 = iVar21 * 7;
                    iVar39 = iVar41;
                    iVar3 = iVar38;
                    iVar4 = iVar21;
                  }
                  else {
                    puVar32[lVar23] = (uchar)pgVar10->colorsTotal;
                    psVar36[0] = 0;
                    psVar36[1] = 0;
                    psVar36[2] = 0;
                    psVar36[3] = 0;
                  }
                  psVar36 = psVar36 + iVar26;
                  lVar23 = lVar23 + local_d8;
                  iVar22 = iVar22 + -1;
                } while (1 < iVar22);
                local_c8 = (short)iVar9;
                sVar5 = (short)iVar8;
                sVar30 = (short)iVar7;
              }
              *psVar36 = sVar30;
              psVar36[1] = sVar5;
              psVar36[2] = local_c8;
              lVar18 = lVar18 + 1;
            } while (lVar18 != iVar24);
          }
        }
        if (-1 < oim->transparent) {
          pgVar10->transparent = pgVar10->colorsTotal;
          pgVar10->colorsTotal = pgVar10->colorsTotal + 1;
        }
        iVar24 = 1;
        if (cimP == (gdImagePtr *)0x0) {
          free_truecolor_image_data(oim);
        }
        goto LAB_0011e93c;
      }
    }
  }
LAB_0011e8cd:
  iVar24 = 0;
  if (oim->trueColor != 0) {
    if (cimP == (gdImagePtr *)0x0) {
      if (pgVar10->pixels != (uchar **)0x0) {
        if (0 < pgVar10->sy) {
          lVar20 = 0;
          do {
            if (pgVar10->pixels[lVar20] != (uchar *)0x0) {
              gdFree(pgVar10->pixels[lVar20]);
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < pgVar10->sy);
        }
        gdFree(pgVar10->pixels);
      }
      pgVar10->pixels = (uchar **)0x0;
    }
    else {
      gdImageDestroy(pgVar10);
      *cimP = (gdImagePtr)0x0;
    }
  }
LAB_0011e93c:
  if (oim_00 != (gdImagePtr)0x0) {
    if (oim_00->pixels != (uchar **)0x0) {
      lVar20 = 0;
      do {
        if (oim_00->pixels[lVar20] != (uchar *)0x0) {
          gdFree(oim_00->pixels[lVar20]);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x20);
      gdFree(oim_00->pixels);
    }
    if (*(void **)&oim_00->sx != (void *)0x0) {
      gdFree(*(void **)&oim_00->sx);
    }
    if (*(void **)(oim_00->red + 3) != (void *)0x0) {
      gdFree(*(void **)(oim_00->red + 3));
    }
    gdFree(oim_00);
  }
  return iVar24;
}

Assistant:

static int gdImageTrueColorToPaletteBody (gdImagePtr oim, int dither, int colorsWanted, gdImagePtr *cimP)
{
	my_cquantize_ptr cquantize = NULL;
	int i, conversionSucceeded=0;

	/* Allocate the JPEG palette-storage */
	size_t arraysize;
	int maxColors = gdMaxColors;
	gdImagePtr nim;

	if (cimP) {
		nim = gdImageCreate(oim->sx, oim->sy);
		*cimP = nim;
		if (!nim) {
			return FALSE;
		}
	} else {
		nim = oim;
	}

	if (!oim->trueColor) {
		/* (Almost) nothing to do! */
		if (cimP) {
			gdImageCopy(nim, oim, 0, 0, 0, 0, oim->sx, oim->sy);
			*cimP = nim;
		}
		return TRUE;
	}

	/* If we have a transparent color (the alphaless mode of transparency), we
	 * must reserve a palette entry for it at the end of the palette. */
	if (oim->transparent >= 0) {
		maxColors--;
	}
	if (colorsWanted > maxColors) {
		colorsWanted = maxColors;
	}
	if (!cimP) {
		nim->pixels = gdCalloc (sizeof (unsigned char *), oim->sy);
		if (!nim->pixels) {
			/* No can do */
			goto outOfMemory;
		}
		for (i = 0; (i < nim->sy); i++) {
			nim->pixels[i] = (unsigned char *) gdCalloc (sizeof (unsigned char), oim->sx);
			if (!nim->pixels[i]) {
				goto outOfMemory;
			}
		}
	}


	if (oim->paletteQuantizationMethod == GD_QUANT_NEUQUANT) {
		if (cimP) { /* NeuQuant alwasy creates a copy, so the new blank image can't be used */
			gdImageDestroy(nim);
		}
		nim = gdImageNeuQuant(oim, colorsWanted, oim->paletteQuantizationSpeed ? oim->paletteQuantizationSpeed : 2);
		if (cimP) {
			*cimP = nim;
		}
		if (!nim) {
			return FALSE;
		} else {
			free_truecolor_image_data(oim);
			gdImageCopy(oim, nim, 0, 0, 0, 0, oim->sx, oim->sy);
			gdImageDestroy(nim);
		}
		return TRUE;
	}


#ifdef HAVE_LIBIMAGEQUANT
	if (oim->paletteQuantizationMethod == GD_QUANT_DEFAULT ||
	        oim->paletteQuantizationMethod == GD_QUANT_LIQ) {
		liq_attr *attr = liq_attr_create_with_allocator(malloc16, free);
		liq_image *image;
		liq_result *remap;
		int remapped_ok = 0;

		liq_set_max_colors(attr, colorsWanted);

		/* by default make it fast to match speed of previous implementation */
		liq_set_speed(attr, oim->paletteQuantizationSpeed ? oim->paletteQuantizationSpeed : 9);
		if (oim->paletteQuantizationMaxQuality) {
			liq_set_quality(attr, oim->paletteQuantizationMinQuality, oim->paletteQuantizationMaxQuality);
		}
		image = liq_image_create_custom(attr, convert_gdpixel_to_rgba, oim, oim->sx, oim->sy, 0);
		remap = liq_quantize_image(attr, image);
		if (!remap) { /* minimum quality not met, leave image unmodified */
			liq_image_destroy(image);
			liq_attr_destroy(attr);
			goto outOfMemory;
		}

		liq_set_dithering_level(remap, dither ? 1 : 0);
		if (LIQ_OK == liq_write_remapped_image_rows(remap, image, output_buf)) {
			remapped_ok = 1;
			const liq_palette *pal = liq_get_palette(remap);
			nim->transparent = -1;
			unsigned int icolor;
			for(icolor=0; icolor < pal->count; icolor++) {
				nim->open[icolor] = 0;
				nim->red[icolor] = pal->entries[icolor].r * gdRedMax/255;
				nim->green[icolor] = pal->entries[icolor].g * gdGreenMax/255;
				nim->blue[icolor] = pal->entries[icolor].b * gdBlueMax/255;
				int alpha = pal->entries[icolor].a * gdAlphaMax/255;
				if (gdAlphaOpaque < gdAlphaTransparent) {
					alpha = gdAlphaTransparent - alpha;
				}
				nim->alpha[icolor] = alpha;
				if (nim->transparent == -1 && alpha == gdAlphaTransparent) {
					nim->transparent = icolor;
				}
			}
			nim->colorsTotal = pal->count;
		}
		liq_result_destroy(remap);
		liq_image_destroy(image);
		liq_attr_destroy(attr);

		if (remapped_ok) {
			if (!cimP) {
				free_truecolor_image_data(oim);
			}
			return TRUE;
		}
	}
#endif

	cquantize = (my_cquantize_ptr) gdCalloc (sizeof (my_cquantizer), 1);
	if (!cquantize) {
		/* No can do */
		goto outOfMemory;
	}
	cquantize->fserrors = NULL;	/* flag optional arrays not allocated */
	cquantize->error_limiter = NULL;


	/* Allocate the histogram/inverse colormap storage */
	cquantize->histogram = (hist3d) gdMalloc (HIST_C0_ELEMS * sizeof (hist2d));
	for (i = 0; i < HIST_C0_ELEMS; i++) {
		cquantize->histogram[i] =
		    (hist2d) gdMalloc (HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof (histcell));
		if (!cquantize->histogram[i]) {
			goto outOfMemory;
		}
	}


	cquantize->fserrors = (FSERRPTR) gdMalloc (3 * sizeof (FSERROR));
	init_error_limit (oim, nim, cquantize);
	arraysize = (size_t) ((nim->sx + 2) * (3 * sizeof (FSERROR)));
	/* Allocate Floyd-Steinberg workspace. */
	cquantize->fserrors = gdReallocEx(cquantize->fserrors, arraysize);
	if (!cquantize->fserrors) {
		goto outOfMemory;
	}
	memset(cquantize->fserrors, 0, arraysize);
	cquantize->on_odd_row = FALSE;

	/* Do the work! */
	zeroHistogram (cquantize->histogram);
	prescan_quantize (oim, nim, cquantize);
	/* TBB 2.0.5: pass colorsWanted, not 256! */
	select_colors (oim, nim, cquantize, colorsWanted);
	zeroHistogram (cquantize->histogram);
	if (dither) {
		pass2_fs_dither (oim, nim, cquantize);
	} else {
		pass2_no_dither (oim, nim, cquantize);
	}
#if 0				/* 2.0.12; we no longer attempt full alpha in palettes */
	if (cquantize->transparentIsPresent) {
		int mt = -1;
		int mtIndex = -1;
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] > mt) {
				mtIndex = i;
				mt = im->alpha[i];
			}
		}
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] == mt) {
				im->alpha[i] = gdAlphaTransparent;
			}
		}
	}
	if (cquantize->opaqueIsPresent) {
		int mo = 128;
		int moIndex = -1;
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] < mo) {
				moIndex = i;
				mo = im->alpha[i];
			}
		}
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] == mo) {
				im->alpha[i] = gdAlphaOpaque;
			}
		}
	}
#endif

	/* If we had a 'transparent' color, increment the color count so it's
	 * officially in the palette and convert the transparent variable to point to
	 * an index rather than a color (Its data already exists and transparent
	 * pixels have already been mapped to it by this point, it is done late as to
	 * avoid color matching / dithering with it). */
	if (oim->transparent >= 0) {
		nim->transparent = nim->colorsTotal;
		nim->colorsTotal++;
	}

	/* Success! Get rid of the truecolor image data. */
	conversionSucceeded = TRUE;
	if (!cimP) {
		free_truecolor_image_data(oim);
	}

	goto freeQuantizeData;
	/* Tediously free stuff. */
outOfMemory:
	conversionSucceeded = FALSE;
	if (oim->trueColor) {
		if (!cimP) {
			/* On failure only */
			if (nim->pixels) {
				for (i = 0; i < nim->sy; i++) {
					if (nim->pixels[i]) {
						gdFree (nim->pixels[i]);
					}
				}
				gdFree (nim->pixels);
			}
			nim->pixels = NULL;
		} else {
			gdImageDestroy(nim);
			*cimP = 0;
		}
	}

freeQuantizeData:
	if (cquantize) {
		if (cquantize->histogram) {
			for (i = 0; i < HIST_C0_ELEMS; i++) {
				if (cquantize->histogram[i]) {
					gdFree (cquantize->histogram[i]);
				}
			}
			gdFree (cquantize->histogram);
		}
		if (cquantize->fserrors) {
			gdFree (cquantize->fserrors);
		}
		if (cquantize->error_limiter_storage) {
			gdFree (cquantize->error_limiter_storage);
		}
		gdFree (cquantize);
	}

	return conversionSucceeded;
}